

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_assignComponentId_Test::~Annotator_assignComponentId_Test
          (Annotator_assignComponentId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, assignComponentId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto component = model->component(0);

    annotator->setModel(model);

    EXPECT_EQ("", component->id());
    EXPECT_EQ("", component->encapsulationId());

    annotator->assignId(component);
    EXPECT_EQ("b4da55", component->id());
    annotator->assignId(component, libcellml::CellmlElementType::COMPONENT_REF);
    EXPECT_EQ("b4da56", component->encapsulationId());
}